

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_bad_identifiers_proto2.pb.cc
# Opt level: O2

void proto2_unittest::TestConflictingSymbolNames::SharedDtor(MessageLite *self)

{
  ZeroFieldsBase *pZVar1;
  ulong uVar2;
  LogMessageFatal local_20;
  
  google::protobuf::internal::InternalMetadata::Delete<google::protobuf::UnknownFieldSet>
            (&self->_internal_metadata_);
  uVar2 = (self->_internal_metadata_).ptr_;
  if ((uVar2 & 1) != 0) {
    uVar2 = *(ulong *)(uVar2 & 0xfffffffffffffffe);
  }
  if (uVar2 == 0) {
    google::protobuf::internal::ArenaStringPtr::Destroy((ArenaStringPtr *)(self + 7));
    google::protobuf::internal::ArenaStringPtr::Destroy
              ((ArenaStringPtr *)&self[7]._internal_metadata_);
    google::protobuf::internal::ArenaStringPtr::Destroy((ArenaStringPtr *)(self + 8));
    google::protobuf::internal::ArenaStringPtr::Destroy
              ((ArenaStringPtr *)&self[8]._internal_metadata_);
    google::protobuf::internal::ArenaStringPtr::Destroy
              ((ArenaStringPtr *)&self[0xf]._internal_metadata_);
    google::protobuf::internal::ArenaStringPtr::Destroy((ArenaStringPtr *)(self + 0x10));
    pZVar1 = (ZeroFieldsBase *)self[0x10]._internal_metadata_.ptr_;
    if (pZVar1 != (ZeroFieldsBase *)0x0) {
      google::protobuf::internal::ZeroFieldsBase::~ZeroFieldsBase(pZVar1);
    }
    operator_delete(pZVar1,0x18);
    pZVar1 = (ZeroFieldsBase *)self[0x11]._vptr_MessageLite;
    if (pZVar1 != (ZeroFieldsBase *)0x0) {
      google::protobuf::internal::ZeroFieldsBase::~ZeroFieldsBase(pZVar1);
    }
    operator_delete(pZVar1,0x18);
    Impl_::~Impl_((Impl_ *)(self + 1));
    return;
  }
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            (&local_20,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/google/protobuf/compiler/cpp/test_bad_identifiers_proto2.pb.cc"
             ,0x1604,"this_.GetArena() == nullptr");
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&local_20);
}

Assistant:

inline void TestConflictingSymbolNames::SharedDtor(MessageLite& self) {
  TestConflictingSymbolNames& this_ = static_cast<TestConflictingSymbolNames&>(self);
  this_._internal_metadata_.Delete<::google::protobuf::UnknownFieldSet>();
  ABSL_DCHECK(this_.GetArena() == nullptr);
  this_._impl_.length_.Destroy();
  this_._impl_.string_.Destroy();
  this_._impl_.some_cord_.Destroy();
  this_._impl_.some_string_piece_.Destroy();
  this_._impl_.release_length_.Destroy();
  this_._impl_.target_.Destroy();
  delete this_._impl_.do__;
  delete this_._impl_.release_do_;
  this_._impl_.~Impl_();
}